

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ReferenceObjectByForeignHandle
          (CSharedMemoryObjectManager *this,CPalThread *pthr,HANDLE hForeignHandle,
          IPalProcess *pForeignProcess,CAllowedObjectTypes *paot,DWORD dwRightsRequired,
          IPalObject **ppobj)

{
  DWORD dwRightsRequired_local;
  CAllowedObjectTypes *paot_local;
  IPalProcess *pForeignProcess_local;
  HANDLE hForeignHandle_local;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  
  fprintf(_stderr,"] %s %s:%d","ReferenceObjectByForeignHandle",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
          ,0x41f);
  fprintf(_stderr,"ReferenceObjectByForeignHandle not yet supported\n");
  return 0x78;
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ReferenceObjectByForeignHandle(
    CPalThread *pthr,
    HANDLE hForeignHandle,
    IPalProcess *pForeignProcess,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequired,
    IPalObject **ppobj               // OUT
    )
{
    //
    // Not implemented for basic shared memory object manager --
    // requires an IPC channel. (For the shared memory object manager
    // PAL_LocalHandleToRemote and PAL_RemoteHandleToLocal must still
    // be used...)
    //

    ASSERT("ReferenceObjectByForeignHandle not yet supported\n");
    return ERROR_CALL_NOT_IMPLEMENTED;
}